

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcApi.c
# Opt level: O0

void Mvc_CoverMakeTautology(Mvc_Cover_t *pCover)

{
  Mvc_Cube_t *pMVar1;
  Mvc_List_t *pList;
  int _i_;
  Mvc_Cube_t *pCubeNew;
  Mvc_Cover_t *pCover_local;
  
  Mvc_CoverMakeEmpty(pCover);
  pMVar1 = Mvc_CubeAlloc(pCover);
  if ((*(uint *)&pMVar1->field_0x8 & 0xffffff) == 0) {
    pMVar1->pData[0] =
         0xffffffff >> ((byte)((uint)*(undefined4 *)&pMVar1->field_0x8 >> 0x18) & 0x1f);
  }
  else if ((*(uint *)&pMVar1->field_0x8 & 0xffffff) == 1) {
    pMVar1->pData[0] = 0xffffffff;
    *(uint *)&pMVar1->field_0x14 =
         0xffffffff >> ((byte)((uint)*(undefined4 *)&pMVar1->field_0x8 >> 0x18) & 0x1f);
  }
  else {
    pMVar1->pData[*(uint *)&pMVar1->field_0x8 & 0xffffff] =
         0xffffffff >> ((byte)((uint)*(undefined4 *)&pMVar1->field_0x8 >> 0x18) & 0x1f);
    pList._4_4_ = *(uint *)&pMVar1->field_0x8 & 0xffffff;
    while (pList._4_4_ = pList._4_4_ - 1, -1 < (int)pList._4_4_) {
      pMVar1->pData[(int)pList._4_4_] = 0xffffffff;
    }
  }
  if ((pCover->lCubes).pHead == (Mvc_Cube_t *)0x0) {
    (pCover->lCubes).pHead = pMVar1;
  }
  else {
    ((pCover->lCubes).pTail)->pNext = pMVar1;
  }
  (pCover->lCubes).pTail = pMVar1;
  pMVar1->pNext = (Mvc_Cube_t *)0x0;
  (pCover->lCubes).nItems = (pCover->lCubes).nItems + 1;
  return;
}

Assistant:

void Mvc_CoverMakeTautology( Mvc_Cover_t * pCover )
{
    Mvc_Cube_t * pCubeNew;
    Mvc_CoverMakeEmpty( pCover );
    pCubeNew = Mvc_CubeAlloc( pCover );
    Mvc_CubeBitFill( pCubeNew );
    Mvc_CoverAddCubeTail( pCover, pCubeNew );
}